

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O1

WriteBatch * __thiscall leveldb::DBImpl::BuildBatchGroup(DBImpl *this,Writer **last_writer)

{
  Writer *pWVar1;
  Writer *pWVar2;
  bool bVar3;
  _Elt_pointer ppWVar4;
  _Elt_pointer ppWVar5;
  ulong uVar6;
  ulong uVar7;
  _Map_pointer pppWVar8;
  WriteBatch *dst;
  
  pWVar1 = *(this->writers_).
            super__Deque_base<leveldb::DBImpl::Writer_*,_std::allocator<leveldb::DBImpl::Writer_*>_>
            ._M_impl.super__Deque_impl_data._M_start._M_cur;
  dst = pWVar1->batch;
  uVar6 = (dst->rep_)._M_string_length;
  uVar7 = 0x100000;
  if (uVar6 < 0x20001) {
    uVar7 = uVar6 + 0x20000;
  }
  *last_writer = pWVar1;
  ppWVar4 = (this->writers_).
            super__Deque_base<leveldb::DBImpl::Writer_*,_std::allocator<leveldb::DBImpl::Writer_*>_>
            ._M_impl.super__Deque_impl_data._M_start._M_last;
  pppWVar8 = (this->writers_).
             super__Deque_base<leveldb::DBImpl::Writer_*,_std::allocator<leveldb::DBImpl::Writer_*>_>
             ._M_impl.super__Deque_impl_data._M_start._M_node;
  ppWVar5 = (this->writers_).
            super__Deque_base<leveldb::DBImpl::Writer_*,_std::allocator<leveldb::DBImpl::Writer_*>_>
            ._M_impl.super__Deque_impl_data._M_start._M_cur + 1;
  if (ppWVar5 == ppWVar4) {
    ppWVar5 = pppWVar8[1];
    pppWVar8 = pppWVar8 + 1;
    ppWVar4 = ppWVar5 + 0x40;
  }
  if (ppWVar5 !=
      (this->writers_).
      super__Deque_base<leveldb::DBImpl::Writer_*,_std::allocator<leveldb::DBImpl::Writer_*>_>.
      _M_impl.super__Deque_impl_data._M_finish._M_cur) {
    do {
      pWVar2 = *ppWVar5;
      if ((pWVar2->sync == true) && (pWVar1->sync != true)) {
LAB_0010d6c8:
        bVar3 = false;
      }
      else {
        if (pWVar2->batch != (WriteBatch *)0x0) {
          uVar6 = uVar6 + (pWVar2->batch->rep_)._M_string_length;
          if (uVar7 < uVar6) goto LAB_0010d6c8;
          if (dst == pWVar1->batch) {
            dst = this->tmp_batch_;
            WriteBatchInternal::Append(dst,pWVar1->batch);
          }
          WriteBatchInternal::Append(dst,pWVar2->batch);
        }
        *last_writer = pWVar2;
        bVar3 = true;
      }
      if (!bVar3) {
        return dst;
      }
      ppWVar5 = ppWVar5 + 1;
      if (ppWVar5 == ppWVar4) {
        ppWVar5 = pppWVar8[1];
        pppWVar8 = pppWVar8 + 1;
        ppWVar4 = ppWVar5 + 0x40;
      }
    } while (ppWVar5 !=
             (this->writers_).
             super__Deque_base<leveldb::DBImpl::Writer_*,_std::allocator<leveldb::DBImpl::Writer_*>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur);
  }
  return dst;
}

Assistant:

WriteBatch* DBImpl::BuildBatchGroup(Writer** last_writer) {
  mutex_.AssertHeld();
  assert(!writers_.empty());
  Writer* first = writers_.front();
  WriteBatch* result = first->batch;
  assert(result != nullptr);

  size_t size = WriteBatchInternal::ByteSize(first->batch);

  // Allow the group to grow up to a maximum size, but if the
  // original write is small, limit the growth so we do not slow
  // down the small write too much.
  size_t max_size = 1 << 20;
  if (size <= (128 << 10)) {
    max_size = size + (128 << 10);
  }

  *last_writer = first;
  std::deque<Writer*>::iterator iter = writers_.begin();
  ++iter;  // Advance past "first"
  for (; iter != writers_.end(); ++iter) {
    Writer* w = *iter;
    if (w->sync && !first->sync) {
      // Do not include a sync write into a batch handled by a non-sync write.
      break;
    }

    if (w->batch != nullptr) {
      size += WriteBatchInternal::ByteSize(w->batch);
      if (size > max_size) {
        // Do not make batch too big
        break;
      }

      // Append to *result
      if (result == first->batch) {
        // Switch to temporary batch instead of disturbing caller's batch
        result = tmp_batch_;
        assert(WriteBatchInternal::Count(result) == 0);
        WriteBatchInternal::Append(result, first->batch);
      }
      WriteBatchInternal::Append(result, w->batch);
    }
    *last_writer = w;
  }
  return result;
}